

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piecewise_linear.cpp
# Opt level: O0

void __thiscall
mp::
BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::LogId>_>
::ApproximateSubinterval
          (BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::LogId>_>
           *this)

{
  reference pvVar1;
  BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::LogId>_>
  *in_RDI;
  double extraout_XMM0_Qa;
  PLPoints *this_00;
  double dVar2;
  double x;
  double dVar3;
  double dx0;
  value_type f0;
  value_type x0;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffc0;
  value_type vVar4;
  PLPoints *pPVar5;
  
  GetPL(in_RDI);
  pvVar1 = std::vector<double,_std::allocator<double>_>::back(in_stack_ffffffffffffffc0);
  pPVar5 = (PLPoints *)*pvVar1;
  GetPL(in_RDI);
  pvVar1 = std::vector<double,_std::allocator<double>_>::back(in_stack_ffffffffffffffc0);
  vVar4 = *pvVar1;
  do {
    (*in_RDI->_vptr_BasicPLApproximator[0x18])(pPVar5);
    dVar3 = extraout_XMM0_Qa;
    (*in_RDI->_vptr_BasicPLApproximator[0x19])(pPVar5,vVar4,in_RDI,&stack0xffffffffffffffe0);
    (*in_RDI->_vptr_BasicPLApproximator[0x1a])(pPVar5,vVar4,in_RDI,&stack0xffffffffffffffe0);
    this_00 = (PLPoints *)(dVar3 + (double)pPVar5);
    dVar2 = ub_sub((BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::LogId>_>
                    *)0x52d4fe);
    if (dVar2 - (double)this_00 < 1e-06) {
      this_00 = (PLPoints *)
                ub_sub((BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::LogId>_>
                        *)0x52d51f);
    }
    GetPL(in_RDI);
    (*in_RDI->_vptr_BasicPLApproximator[9])(this_00);
    vVar4 = x;
    PLPoints::AddPoint(this_00,x,dVar3);
    pPVar5 = this_00;
    dVar3 = ub_sub((BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::LogId>_>
                    *)0x52d580);
  } while ((double)this_00 < dVar3);
  return;
}

Assistant:

void BasicPLApproximator<FuncCon>::ApproximateSubinterval() {
  assert(GetPL().size());
  auto x0 = GetPL().x_.back();
  auto f0 = GetPL().y_.back();    // can be != f(x0)
  /// Simple: breakpoints on the function
  do {
    auto dx0 = ComputeInitialStepLength(x0);
    assert(x0+dx0 <= ub_sub());
    IncreaseStepWhileErrorSmallEnough(x0, f0, dx0);
    DecreaseStepWhileErrorTooBig(x0, f0, dx0);
    x0 += dx0;
    if (ub_sub()-x0 < 1e-6)        // constant param
      x0 = ub_sub();
    GetPL().AddPoint(x0, f0 = eval(x0));
  } while (x0 < ub_sub());
}